

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMParentNode.cpp
# Opt level: O2

void __thiscall xercesc_4_0::DOMParentNode::normalize(DOMParentNode *this)

{
  DOMNode *oldChild;
  int iVar1;
  DOMChildNode *pDVar2;
  undefined4 extraout_var;
  DOMNode *p;
  
  oldChild = this->fFirstChild;
  while (p = oldChild, p != (DOMNode *)0x0) {
    pDVar2 = castToChildImpl(p);
    oldChild = pDVar2->nextSibling;
    if (((oldChild == (DOMNode *)0x0) || (iVar1 = (*p->_vptr_DOMNode[4])(p), iVar1 != 3)) ||
       (iVar1 = (*oldChild->_vptr_DOMNode[4])(oldChild), iVar1 != 3)) {
      iVar1 = (*p->_vptr_DOMNode[4])(p);
      if (iVar1 == 1) {
        (*p->_vptr_DOMNode[0x14])(p);
      }
    }
    else {
      iVar1 = (*oldChild->_vptr_DOMNode[0x28])(oldChild);
      (*p->_vptr_DOMNode[0x2b])(p,CONCAT44(extraout_var,iVar1));
      removeChild(this,oldChild);
      oldChild = p;
    }
  }
  return;
}

Assistant:

void DOMParentNode::normalize()
{
    DOMNode *kid, *next;
    for (kid = fFirstChild; kid != 0; kid = next)
    {
        next = castToChildImpl(kid)->nextSibling;

        // If kid and next are both Text nodes (but _not_ CDATASection,
        // which is a subclass of Text), they can be merged.
        if (next != 0 &&
            kid->getNodeType() == DOMNode::TEXT_NODE   &&
            next->getNodeType() == DOMNode::TEXT_NODE )
        {
            ((DOMTextImpl *) kid)->appendData(((DOMTextImpl *) next)->getData());
            // revisit:
            //   should I release the removed node?
            //   not released in case user still referencing it externally
            removeChild(next);
            next = kid; // Don't advance; there might be another.
        }

        // Otherwise it might be an Element, which is handled recursively
        else
            if (kid->getNodeType() == DOMNode::ELEMENT_NODE)
                kid->normalize();
    }

    // changed() will have occurred when the removeChild() was done,
    // so does not have to be reissued.
}